

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O0

bool __thiscall
pybind11::detail::
map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
::load(map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
       *this,handle src,bool convert)

{
  bool bVar1;
  PyObject **ppPVar2;
  template_cast_op_type<std::__cxx11::basic_string<char>_> __args;
  template_cast_op_type<double> __args_1;
  pair<pybind11::handle,_pybind11::handle> pVar3;
  byte local_122;
  handle local_e0;
  handle local_d8;
  handle local_d0;
  pair<pybind11::handle,_pybind11::handle> it;
  dict_iterator __end3;
  undefined1 local_90 [8];
  dict_iterator __begin3;
  dict *__range3;
  value_conv vconv;
  key_conv kconv;
  dict local_38;
  dict d;
  bool convert_local;
  map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *this_local;
  handle src_local;
  
  d.super_object.super_handle.m_ptr = (object)(object)src.m_ptr;
  bVar1 = isinstance<pybind11::dict,_0>(src);
  if (bVar1) {
    reinterpret_borrow<pybind11::dict>((pybind11 *)&local_38,src);
    type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::type_caster((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                   *)&vconv);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
    ::clear(&this->value);
    __begin3.pos = (ssize_t)&local_38;
    dict::begin((dict_iterator *)local_90,&local_38);
    dict::end((dict_iterator *)&it.second,(dict *)__begin3.pos);
    while (bVar1 = dict_iterator::operator!=((dict_iterator *)local_90,(dict_iterator *)&it.second),
          bVar1) {
      pVar3 = dict_iterator::operator*((dict_iterator *)local_90);
      it.first = pVar3.second.m_ptr;
      local_d0 = pVar3.first.m_ptr;
      ppPVar2 = handle::ptr(&local_d0);
      handle::handle(&local_d8,*ppPVar2);
      bVar1 = type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
              ::load((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                      *)&vconv,local_d8,convert);
      local_122 = 1;
      if (bVar1) {
        ppPVar2 = handle::ptr(&it.first);
        handle::handle(&local_e0,*ppPVar2);
        bVar1 = type_caster<double,_void>::load
                          ((type_caster<double,_void> *)&__range3,local_e0,convert);
        local_122 = bVar1 ^ 0xff;
      }
      if ((local_122 & 1) != 0) {
        src_local.m_ptr._7_1_ = false;
        goto LAB_0070ba12;
      }
      __args = cast_op<std::__cxx11::string>
                         ((make_caster<std::__cxx11::basic_string<char>_> *)&vconv);
      __args_1 = cast_op<double>((make_caster<double> *)&__range3);
      std::
      map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
      ::emplace<std::__cxx11::string&,double&>
                ((map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>
                  *)this,__args,__args_1);
      dict_iterator::operator++((dict_iterator *)local_90);
    }
    src_local.m_ptr._7_1_ = true;
LAB_0070ba12:
    type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::~type_caster((type_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                    *)&vconv);
    dict::~dict(&local_38);
  }
  else {
    src_local.m_ptr._7_1_ = false;
  }
  return src_local.m_ptr._7_1_;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<dict>(src))
            return false;
        auto d = reinterpret_borrow<dict>(src);
        key_conv kconv;
        value_conv vconv;
        value.clear();
        for (auto it : d) {
            if (!kconv.load(it.first.ptr(), convert) ||
                !vconv.load(it.second.ptr(), convert))
                return false;
            value.emplace(cast_op<Key>(kconv), cast_op<Value>(vconv));
        }
        return true;
    }